

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  int iVar2;
  global_State *pgVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  TString *pTVar7;
  size_t sVar8;
  uint uVar9;
  TString **ppTVar10;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    uVar9 = pgVar3->seed ^ (uint)l;
    if (l != 0) {
      sVar8 = l;
      do {
        uVar9 = uVar9 ^ (uint)(byte)str[sVar8 - 1] + (uVar9 >> 2) + uVar9 * 0x20;
        sVar8 = sVar8 + ~(l >> 5);
      } while (l >> 5 < sVar8);
    }
    ppTVar10 = (pgVar3->strt).hash;
    iVar2 = (pgVar3->strt).size;
    uVar5 = iVar2 - 1U & uVar9;
    for (pTVar7 = ppTVar10[(int)uVar5]; pTVar7 != (TString *)0x0; pTVar7 = (pTVar7->u).hnext) {
      if ((pTVar7->shrlen == l) && (iVar6 = bcmp(str,pTVar7 + 1,l), iVar6 == 0)) {
        bVar4 = pTVar7->marked ^ 3;
        if (((pgVar3->currentwhite ^ 3) & bVar4) != 0) {
          return pTVar7;
        }
        pTVar7->marked = bVar4;
        return pTVar7;
      }
    }
    ppTVar10 = ppTVar10 + (int)uVar5;
    if ((iVar2 < 0x40000000) && (iVar2 <= (pgVar3->strt).nuse)) {
      luaS_resize(L,iVar2 * 2);
      ppTVar10 = (pgVar3->strt).hash + ((long)(int)uVar9 & (long)(pgVar3->strt).size - 1U);
    }
    pTVar7 = (TString *)luaC_newobj(L,4,l + 0x19);
    pTVar7->hash = uVar9;
    pTVar7->extra = '\0';
    *(lu_byte *)((long)&pTVar7[1].next + l) = '\0';
    memcpy(pTVar7 + 1,str,l);
    pTVar7->shrlen = (lu_byte)l;
    (pTVar7->u).hnext = *ppTVar10;
    *ppTVar10 = pTVar7;
    piVar1 = &(pgVar3->strt).nuse;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if (0x7fffffffffffffe6 < l) {
      luaM_toobig(L);
    }
    uVar9 = L->l_G->seed;
    pTVar7 = (TString *)luaC_newobj(L,0x14,l + 0x19);
    pTVar7->hash = uVar9;
    pTVar7->extra = '\0';
    *(lu_byte *)((long)&pTVar7[1].next + l) = '\0';
    (pTVar7->u).lnglen = l;
    memcpy(pTVar7 + 1,str,l);
  }
  return pTVar7;
}

Assistant:

TString *luaS_newlstr(lua_State *L, const char *str, size_t l) {
    if (l <= LUAI_MAXSHORTLEN)  /* short string? */
        return internshrstr(L, str, l);
    else {
        TString *ts;
        if (l >= (MAX_SIZE - sizeof(TString)) / sizeof(char))
            luaM_toobig(L);
        ts = luaS_createlngstrobj(L, l);
        memcpy(getstr(ts), str, l * sizeof(char));
        return ts;
    }
}